

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool cJSON_ReplaceItemViaPointer(cJSON *parent,cJSON *item,cJSON *replacement)

{
  cJSON *pcVar1;
  cJSON *pcVar2;
  cJSON_bool cVar3;
  
  cVar3 = 0;
  if ((replacement != (cJSON *)0x0 && parent != (cJSON *)0x0) && (cVar3 = 1, replacement != item)) {
    pcVar1 = item->next;
    replacement->next = pcVar1;
    pcVar2 = item->prev;
    replacement->prev = pcVar2;
    if (pcVar1 != (cJSON *)0x0) {
      pcVar1->prev = replacement;
      pcVar2 = replacement->prev;
    }
    if (pcVar2 != (cJSON *)0x0) {
      pcVar2->next = replacement;
    }
    if (parent->child == item) {
      parent->child = replacement;
    }
    item->next = (cJSON *)0x0;
    item->prev = (cJSON *)0x0;
    cJSON_Delete(item);
  }
  return cVar3;
}

Assistant:

CJSON_PUBLIC(cJSON_bool) cJSON_ReplaceItemViaPointer(cJSON * const parent, cJSON * const item, cJSON * replacement)
{
    if ((parent == NULL) || (replacement == NULL))
    {
        return false;
    }

    if (replacement == item)
    {
        return true;
    }

    replacement->next = item->next;
    replacement->prev = item->prev;

    if (replacement->next != NULL)
    {
        replacement->next->prev = replacement;
    }
    if (replacement->prev != NULL)
    {
        replacement->prev->next = replacement;
    }
    if (parent->child == item)
    {
        parent->child = replacement;
    }

    item->next = NULL;
    item->prev = NULL;
    cJSON_Delete(item);

    return true;
}